

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer::Layer(Layer *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Layer_00176060;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10dba6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10dbb4);
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Layer::Layer()
{
    one_blob_only = false;
    support_inplace = false;
}